

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  unsigned_long_long uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FP32 FVar5;
  reference pvVar6;
  unsigned_long_long *puVar7;
  byte *pbVar8;
  uint *puVar9;
  uchar *src;
  void *pvVar10;
  reference pvVar11;
  size_type sVar12;
  reference pvVar13;
  reference pvVar14;
  char *pcVar15;
  undefined8 *in_RDX;
  char *in_RSI;
  int *in_RDI;
  int c_2;
  float f;
  int x_3;
  FP32 f32;
  FP16 f16;
  int x_2;
  uint ui;
  int x_1;
  int c_1;
  unsigned_long_long dataOffset;
  int samplesPerLine;
  int i_1;
  int channelOffset;
  vector<int,_std::allocator<int>_> channelOffsetList;
  int sampleSize;
  unsigned_long dstLen_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  int i;
  unsigned_long dstLen;
  vector<int,_std::allocator<int>_> pixelOffsetTable;
  longlong unpackedSampleDataSize;
  longlong packedSampleDataSize;
  longlong packedOffsetTableSize;
  int lineNo;
  uchar *dataPtr;
  int y_4;
  int y_3;
  int y_2;
  int c;
  longlong offset;
  int y_1;
  vector<long_long,_std::allocator<long_long>_> offsets;
  int numBlocks;
  vector<float,_std::allocator<float>_> image;
  int dataHeight;
  int dataWidth;
  int h;
  int w;
  int y;
  int x;
  char *marker_next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrType;
  string attrName;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  int numChannels;
  int compressionType;
  int numScanlineBlocks;
  int dh;
  int dw;
  int dy;
  int dx;
  char header [4];
  char *marker;
  char *head;
  size_t ret;
  vector<char,_std::allocator<char>_> buf;
  size_t filesize;
  FILE *fp;
  size_type in_stack_fffffffffffffc58;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  string *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffcb8;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *in_stack_fffffffffffffcc0;
  undefined1 *srcSize;
  unsigned_long *uncompressedSize;
  undefined4 in_stack_fffffffffffffd14;
  int local_268;
  int local_260;
  FP16 local_254;
  int local_250;
  int local_248;
  int local_244;
  int local_234;
  int local_230;
  vector<int,_std::allocator<int>_> local_228;
  int local_20c;
  unsigned_long_long local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  int local_1dc;
  long local_1d8;
  vector<int,_std::allocator<int>_> local_1c8;
  unsigned_long_long local_1b0;
  unsigned_long_long local_1a8;
  unsigned_long_long local_1a0;
  uint local_194;
  uint *local_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  unsigned_long_long local_178;
  int local_170;
  undefined1 local_169;
  vector<long_long,_std::allocator<long_long>_> local_168;
  int local_150;
  unsigned_long local_149 [3];
  int local_130;
  int local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  unsigned_long_long *local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  string local_f8 [32];
  string local_d8 [32];
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_b8;
  int local_9c;
  uint local_98;
  int local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  int local_80;
  undefined4 local_7c;
  unsigned_long_long *local_78;
  reference local_70;
  size_t local_68;
  allocator<char> local_49;
  vector<char,_std::allocator<char>_> local_48;
  size_t local_30;
  FILE *local_28;
  undefined8 *local_20;
  int *local_10;
  int local_4;
  
  if (in_RDI == (int *)0x0) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.";
    }
    local_4 = -1;
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    local_28 = fopen(in_RSI,"rb");
    if (local_28 == (FILE *)0x0) {
      if (local_20 != (undefined8 *)0x0) {
        *local_20 = "Cannot read file.";
      }
      local_4 = -1;
    }
    else {
      fseek(local_28,0,2);
      local_30 = ftell(local_28);
      fseek(local_28,0,0);
      if (local_30 == 0) {
        fclose(local_28);
        if (local_20 != (undefined8 *)0x0) {
          *local_20 = "File size is zero.";
        }
        local_4 = -1;
      }
      else {
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   (size_type)in_stack_fffffffffffffc78,(allocator_type *)in_stack_fffffffffffffc70)
        ;
        std::allocator<char>::~allocator(&local_49);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
        local_68 = fread(pvVar6,1,local_30,local_28);
        fclose(local_28);
        local_70 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
        puVar7 = (unsigned_long_long *)
                 std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
        local_7c = 0x1312f76;
        if ((int)*puVar7 == 0x1312f76) {
          local_78 = (unsigned_long_long *)((long)puVar7 + 4);
          if ((((*(char *)local_78 == '\x02') && (*(char *)((long)puVar7 + 5) == '\b')) &&
              (*(char *)((long)puVar7 + 6) == '\0')) && (*(char *)((long)puVar7 + 7) == '\0')) {
            local_78 = puVar7 + 1;
            local_84 = 0xffffffff;
            local_88 = 0xffffffff;
            local_8c = 0xffffffff;
            local_90 = 0xffffffff;
            local_94 = 1;
            local_98 = 0xffffffff;
            local_9c = -1;
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      *)0x12c47c);
            do {
              std::__cxx11::string::string(local_d8);
              std::__cxx11::string::string(local_f8);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12c4bb);
              local_118 = (unsigned_long_long *)
                          anon_unknown.dwarf_12ea4::ReadAttribute
                                    (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                     (char *)in_stack_fffffffffffffc60);
              if (local_118 == (unsigned_long_long *)0x0) {
                local_78 = (unsigned_long_long *)((long)local_78 + 1);
                local_80 = 2;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_d8);
                if (iVar3 == 0) {
                  pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     (&local_110,0);
                  if (3 < *pbVar8) {
                    if (local_20 != (undefined8 *)0x0) {
                      *local_20 = "Unsupported compression type.";
                    }
                    local_4 = -5;
                    local_80 = 1;
                    goto LAB_0012c911;
                  }
                  pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     (&local_110,0);
                  local_98 = (uint)*pbVar8;
                  if (local_98 == 3) {
                    local_94 = 0x10;
                  }
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)local_d8);
                  if (iVar3 == 0) {
                    anon_unknown.dwarf_12ea4::ReadChannelInfo
                              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
                    sVar12 = std::
                             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             ::size(&local_b8);
                    local_9c = (int)sVar12;
                    if (local_9c < 1) {
                      if (local_20 != (undefined8 *)0x0) {
                        *local_20 = "Invalid channels format.";
                      }
                      local_4 = -6;
                      local_80 = 1;
                      goto LAB_0012c911;
                    }
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)local_d8);
                    if (iVar3 == 0) {
                      puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                      local_84 = *puVar9;
                      puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                      local_88 = *puVar9;
                      puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                      local_8c = *puVar9;
                      puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                      local_90 = *puVar9;
                      bVar2 = anon_unknown.dwarf_12ea4::IsBigEndian();
                      if (bVar2) {
                        anon_unknown.dwarf_12ea4::swap4(&local_84);
                        anon_unknown.dwarf_12ea4::swap4(&local_88);
                        anon_unknown.dwarf_12ea4::swap4(&local_8c);
                        anon_unknown.dwarf_12ea4::swap4(&local_90);
                      }
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)local_d8);
                      if (iVar3 == 0) {
                        puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58
                                             );
                        local_11c = *puVar9;
                        puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58
                                             );
                        local_120 = *puVar9;
                        puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58
                                             );
                        local_124 = *puVar9;
                        puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58
                                             );
                        local_128 = *puVar9;
                        bVar2 = anon_unknown.dwarf_12ea4::IsBigEndian();
                        in_stack_fffffffffffffd14 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd14);
                        if (bVar2) {
                          anon_unknown.dwarf_12ea4::swap4(&local_11c);
                          anon_unknown.dwarf_12ea4::swap4(&local_120);
                          anon_unknown.dwarf_12ea4::swap4(&local_124);
                          anon_unknown.dwarf_12ea4::swap4(&local_128);
                        }
                      }
                    }
                  }
                }
                local_78 = local_118;
                local_80 = 0;
              }
LAB_0012c911:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffc70);
              std::__cxx11::string::~string(local_f8);
              std::__cxx11::string::~string(local_d8);
            } while (local_80 == 0);
            if (local_80 == 2) {
              local_12c = (local_8c - local_84) + 1;
              local_130 = (local_90 - local_88) + 1;
              src = (uchar *)(long)(local_12c * local_130 * 4);
              uncompressedSize = local_149;
              iVar3 = local_80;
              std::allocator<float>::allocator((allocator<float> *)0x12c9c7);
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                         (size_type)in_stack_fffffffffffffc78,
                         (allocator_type *)in_stack_fffffffffffffc70);
              std::allocator<float>::~allocator((allocator<float> *)0x12c9f3);
              local_150 = local_130 / local_94;
              if (local_150 * local_94 < local_130) {
                local_150 = local_150 + 1;
              }
              srcSize = &local_169;
              std::allocator<long_long>::allocator((allocator<long_long> *)0x12ca7f);
              std::vector<long_long,_std::allocator<long_long>_>::vector
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                         (size_type)in_stack_fffffffffffffc78,
                         (allocator_type *)in_stack_fffffffffffffc70);
              std::allocator<long_long>::~allocator((allocator<long_long> *)0x12caab);
              for (local_170 = 0; local_170 < local_150; local_170 = local_170 + 1) {
                local_178 = *local_78;
                bVar2 = anon_unknown.dwarf_12ea4::IsBigEndian();
                if (bVar2) {
                  anon_unknown.dwarf_12ea4::swap8(&local_178);
                }
                uVar1 = local_178;
                local_78 = local_78 + 1;
                puVar7 = (unsigned_long_long *)
                         std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                   (&local_168,(long)local_170);
                *puVar7 = uVar1;
              }
              if (((local_98 == 0) || (local_98 == 2)) || (local_98 == 3)) {
                pvVar10 = malloc((long)local_9c << 3);
                *(void **)(local_10 + 4) = pvVar10;
                for (local_17c = 0; local_17c < local_9c; local_17c = local_17c + 1) {
                  pvVar10 = malloc((long)local_130 << 3);
                  *(void **)(*(long *)(local_10 + 4) + (long)local_17c * 8) = pvVar10;
                  for (local_180 = 0; local_180 < local_130; local_180 = local_180 + 1) {
                  }
                }
                pvVar10 = malloc((long)local_130 << 3);
                *(void **)(local_10 + 6) = pvVar10;
                for (local_184 = 0; local_184 < local_130; local_184 = local_184 + 1) {
                  pvVar10 = malloc((long)local_12c << 2);
                  *(void **)(*(long *)(local_10 + 6) + (long)local_184 * 8) = pvVar10;
                }
                for (local_188 = 0; pvVar6 = local_70, local_188 < local_150;
                    local_188 = local_188 + 1) {
                  pvVar11 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                      (&local_168,(long)local_188);
                  local_190 = (uint *)(pvVar6 + *pvVar11);
                  local_194 = *local_190;
                  local_1a0 = *(unsigned_long_long *)(local_190 + 1);
                  local_1a8 = *(unsigned_long_long *)(local_190 + 3);
                  local_1b0 = *(unsigned_long_long *)(local_190 + 5);
                  bVar2 = anon_unknown.dwarf_12ea4::IsBigEndian();
                  if (bVar2) {
                    anon_unknown.dwarf_12ea4::swap4(&local_194);
                    anon_unknown.dwarf_12ea4::swap8(&local_1a0);
                    anon_unknown.dwarf_12ea4::swap8(&local_1a8);
                    anon_unknown.dwarf_12ea4::swap8(&local_1b0);
                  }
                  std::allocator<int>::allocator((allocator<int> *)0x12ce3d);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (size_type)in_stack_fffffffffffffc78,
                             (allocator_type *)in_stack_fffffffffffffc70);
                  std::allocator<int>::~allocator((allocator<int> *)0x12ce63);
                  sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_1c8);
                  local_1d8 = sVar12 << 2;
                  std::vector<int,_std::allocator<int>_>::at
                            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                  anon_unknown.dwarf_12ea4::DecompressZip
                            ((uchar *)CONCAT44(in_stack_fffffffffffffd14,iVar3),uncompressedSize,src
                             ,(unsigned_long)srcSize);
                  for (local_1dc = 0; local_1dc < local_12c; local_1dc = local_1dc + 1) {
                    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                        (&local_1c8,(long)local_1dc);
                    *(value_type *)
                     (*(long *)(*(long *)(local_10 + 6) + (long)local_188 * 8) + (long)local_1dc * 4
                     ) = *pvVar13;
                  }
                  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12cf88);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (size_type)in_stack_fffffffffffffc78,
                             (allocator_type *)in_stack_fffffffffffffc70);
                  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12cfae);
                  local_208 = local_1b0;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                  anon_unknown.dwarf_12ea4::DecompressZip
                            ((uchar *)CONCAT44(in_stack_fffffffffffffd14,iVar3),uncompressedSize,src
                             ,(unsigned_long)srcSize);
                  local_20c = 0xffffffff;
                  std::allocator<int>::allocator((allocator<int> *)0x12d031);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (size_type)in_stack_fffffffffffffc78,
                             (allocator_type *)in_stack_fffffffffffffc70);
                  std::allocator<int>::~allocator((allocator<int> *)0x12d057);
                  local_230 = 0;
                  for (local_234 = 0; local_234 < local_9c; local_234 = local_234 + 1) {
                    in_stack_fffffffffffffc84 = local_230;
                    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                        (&local_228,(long)local_234);
                    *pvVar13 = in_stack_fffffffffffffc84;
                    pvVar14 = std::
                              vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                              ::operator[](&local_b8,(long)local_234);
                    if (pvVar14->pixelType == 0) {
                      local_230 = local_230 + 4;
                    }
                    else {
                      pvVar14 = std::
                                vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ::operator[](&local_b8,(long)local_234);
                      if (pvVar14->pixelType == 1) {
                        local_230 = local_230 + 2;
                      }
                      else {
                        pvVar14 = std::
                                  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                  ::operator[](&local_b8,(long)local_234);
                        if (pvVar14->pixelType == 2) {
                          local_230 = local_230 + 4;
                        }
                      }
                    }
                  }
                  local_20c = local_230;
                  sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     (&local_1f8);
                  iVar4 = (int)(sVar12 / (ulong)(long)local_20c);
                  for (local_244 = 0; local_244 < local_9c; local_244 = local_244 + 1) {
                    pvVar10 = malloc((long)iVar4 << 2);
                    *(void **)(*(long *)(*(long *)(local_10 + 4) + (long)local_244 * 8) +
                              (long)local_188 * 8) = pvVar10;
                    pvVar14 = std::
                              vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                              ::operator[](&local_b8,(long)local_244);
                    if (pvVar14->pixelType == 0) {
                      for (local_248 = 0; local_248 < iVar4; local_248 = local_248 + 1) {
                        in_stack_fffffffffffffc78 =
                             (string *)
                             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                        *(float *)(*(long *)(*(long *)(*(long *)(local_10 + 4) + (long)local_244 * 8
                                                      ) + (long)local_188 * 8) + (long)local_248 * 4
                                  ) = (float)*(uint *)in_stack_fffffffffffffc78;
                      }
                    }
                    else {
                      pvVar14 = std::
                                vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ::operator[](&local_b8,(long)local_244);
                      if (pvVar14->pixelType == 1) {
                        for (local_250 = 0; local_250 < iVar4; local_250 = local_250 + 1) {
                          in_stack_fffffffffffffc70 =
                               (string *)
                               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                          local_254.u = *(undefined2 *)in_stack_fffffffffffffc70;
                          FVar5 = anon_unknown.dwarf_12ea4::half_to_float(local_254);
                          *(FP32 *)(*(long *)(*(long *)(*(long *)(local_10 + 4) +
                                                       (long)local_244 * 8) + (long)local_188 * 8) +
                                   (long)local_250 * 4) = FVar5;
                        }
                      }
                      else {
                        for (local_260 = 0; local_260 < iVar4; local_260 = local_260 + 1) {
                          in_stack_fffffffffffffc60 =
                               (vector<int,_std::allocator<int>_> *)
                               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                          *(undefined4 *)
                           (*(long *)(*(long *)(*(long *)(local_10 + 4) + (long)local_244 * 8) +
                                     (long)local_188 * 8) + (long)local_260 * 4) =
                               *(undefined4 *)
                                &(in_stack_fffffffffffffc60->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start;
                        }
                      }
                    }
                  }
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffc70);
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70);
                }
                local_10[8] = local_12c;
                local_10[9] = local_130;
                pvVar10 = malloc((long)local_9c << 3);
                *(void **)(local_10 + 2) = pvVar10;
                for (local_268 = 0; local_268 < local_9c; local_268 = local_268 + 1) {
                  std::
                  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ::operator[](&local_b8,(long)local_268);
                  pcVar15 = (char *)std::__cxx11::string::c_str();
                  pcVar15 = strdup(pcVar15);
                  *(char **)(*(long *)(local_10 + 2) + (long)local_268 * 8) = pcVar15;
                }
                *local_10 = local_9c;
                local_4 = 0;
              }
              else {
                if (local_20 != (undefined8 *)0x0) {
                  *local_20 = "Unsupported format.";
                }
                local_4 = -10;
              }
              local_80 = 1;
              std::vector<long_long,_std::allocator<long_long>_>::~vector
                        ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffc70)
              ;
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc70);
            }
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       *)in_stack_fffffffffffffc70);
          }
          else {
            if (local_20 != (undefined8 *)0x0) {
              *local_20 = "Unsupported version or scanline.";
            }
            local_4 = -4;
            local_80 = 1;
          }
        }
        else {
          if (local_20 != (undefined8 *)0x0) {
            *local_20 = "Header mismatch.";
          }
          local_4 = -3;
          local_80 = 1;
          local_78 = puVar7;
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc70);
      }
    }
  }
  return local_4;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) ==
           sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}